

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-projection.c
# Opt level: O2

_Bool borg_projectable_dark(wchar_t y1,wchar_t x1,wchar_t y2,wchar_t x2)

{
  wchar_t wVar1;
  wchar_t wVar2;
  _Bool _Var3;
  borg_grid *ag;
  uint uVar4;
  int iVar5;
  wchar_t x;
  wchar_t y;
  wchar_t local_48;
  wchar_t local_44;
  wchar_t local_40;
  wchar_t local_3c;
  angband_constants *local_38;
  
  local_38 = z_info;
  uVar4 = 0;
  iVar5 = 0;
  local_48 = x1;
  local_44 = y1;
  local_40 = y1;
  local_3c = x1;
  while( true ) {
    wVar2 = local_44;
    wVar1 = local_48;
    if (local_38->max_range < uVar4) {
      return false;
    }
    ag = borg_grids[local_44] + local_48;
    if (uVar4 != 0) {
      iVar5 = iVar5 + (uint)(ag->feat == '\0');
      _Var3 = borg_cave_floor_grid(ag);
      if (!_Var3) {
        return false;
      }
      local_38 = z_info;
    }
    if (((wVar1 == x2) && (wVar2 == y2)) && (0 < iVar5)) break;
    if (ag->kill != '\0') {
      return false;
    }
    borg_inc_motion(&local_44,&local_48,local_40,local_3c,y2,x2);
    uVar4 = uVar4 + 1;
  }
  return true;
}

Assistant:

bool borg_projectable_dark(int y1, int x1, int y2, int x2)
{
    int        dist, y, x;
    int        unknown = 0;
    borg_grid *ag;

    /* Start at the initial location */
    y = y1;
    x = x1;

    /* Simulate the spell/missile path */
    for (dist = 0; dist <= z_info->max_range; dist++) {
        /* Get the grid */
        ag = &borg_grids[y][x];

        /* We want at least 1 unknown grid */
        if (dist && (ag->feat == FEAT_NONE))
            unknown++;

        /* Never pass through walls/doors */
        if (dist && (!borg_cave_floor_grid(ag)))
            break;

        /* Check for arrival at "final target" */
        if ((x == x2) && (y == y2) && unknown >= 1)
            return true;

        /* Stop at monsters */
        if (ag->kill)
            break;

        /* Calculate the new location */
        borg_inc_motion(&y, &x, y1, x1, y2, x2);
    }

    /* Assume obstruction */
    return false;
}